

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLookupResultValid
               (Texture3DView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  ConstPixelBufferAccess *access;
  ConstPixelBufferAccess *access_00;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int dim_03;
  ConstPixelBufferAccess *pCVar1;
  Vec4 *b;
  bool bVar2;
  int iVar3;
  TextureChannelClass TVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int extraout_EAX;
  uint uVar11;
  uint c;
  int extraout_EAX_00;
  ulong uVar12;
  uint c_00;
  FilterMode FVar13;
  int level;
  int iVar14;
  int c_01;
  uint c_02;
  int i1;
  int iVar15;
  int iVar16;
  int iVar17;
  int i0;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float s;
  float s_00;
  float fVar35;
  uint extraout_XMM0_Db;
  float fVar40;
  uint extraout_XMM0_Dc;
  float fVar42;
  undefined1 auVar36 [16];
  uint extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 auVar37 [16];
  float fVar41;
  float fVar43;
  undefined1 auVar39 [16];
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  uint uVar52;
  uint uVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float s_01;
  float s_02;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  float local_520;
  int d1;
  float local_4fc;
  int d0;
  int w1;
  int w0;
  float local_488;
  float local_484;
  float local_474;
  int h0;
  int h1;
  Vec4 c10;
  Vec4 c11;
  Vec4 cz0;
  float a0;
  float a1;
  Vec2 wBounds1;
  Vec2 wBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec4 maxVal;
  Vec4 cz1;
  Vec4 minVal;
  Vec2 local_310;
  tcu local_308 [16];
  undefined1 local_2f8 [16];
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  BVec4 *local_2a8;
  Vec4 *local_2a0;
  tcu local_298 [16];
  float local_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  undefined1 local_278 [16];
  float local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  Vec2 uBounds1_1;
  Vector<float,_4> local_248;
  Vector<float,_4> local_238;
  Vector<float,_4> local_228;
  Vector<float,_4> local_218;
  tcu local_208 [16];
  tcu local_1f8 [16];
  ColorQuad quad10;
  ColorQuad quad01;
  ColorQuad quad00;
  tcu local_70 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar38 [16];
  
  fVar20 = lodBounds->m_data[0];
  fVar21 = lodBounds->m_data[1];
  fVar19 = sampler->lodThreshold;
  if (fVar20 <= fVar19) {
    fStack_2d0 = 0.0;
    fStack_2cc = 0.0;
    local_2d8 = fVar20;
    fStack_2d4 = fVar21;
    bVar2 = isLevelSampleResultValid(texture->m_levels,sampler,sampler->magFilter,prec,coord,result)
    ;
    if (bVar2) {
      return bVar2;
    }
    fVar20 = local_2d8;
    fVar22 = fStack_2d4;
    fVar23 = fStack_2d0;
    fVar24 = fStack_2cc;
    if (fVar21 <= fVar19) {
      return bVar2;
    }
  }
  else {
    fVar22 = fVar21;
    fVar23 = 0.0;
    fVar24 = 0.0;
    if (fVar21 <= fVar19) {
      return false;
    }
  }
  FVar13 = sampler->minFilter;
  iVar17 = texture->m_numLevels;
  iVar15 = iVar17 + -1;
  if (0 < iVar15 && (FVar13 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0) {
    local_2d8 = fVar20;
    fStack_2d4 = fVar22;
    fStack_2d0 = fVar23;
    fStack_2cc = fVar24;
    fVar19 = floorf(fVar20);
    iVar3 = (int)fVar19;
    iVar17 = iVar17 + -2;
    iVar15 = iVar17;
    if (iVar3 < iVar17) {
      iVar15 = iVar3;
    }
    if (iVar3 < 0) {
      iVar15 = 0;
    }
    fVar19 = floorf(fVar21);
    iVar3 = (int)fVar19;
    if (iVar3 < iVar17) {
      iVar17 = iVar3;
    }
    if (iVar3 < 0) {
      iVar17 = 0;
    }
    local_2a0 = &prec->colorThreshold;
    local_2a8 = &prec->colorMask;
    do {
      while( true ) {
        if (iVar17 < iVar15) {
          return false;
        }
        fVar19 = (float)iVar15;
        pCVar1 = texture->m_levels;
        access = pCVar1 + iVar15;
        iVar16 = iVar15 + 1;
        access_00 = pCVar1 + iVar16;
        auVar46._0_4_ = local_2d8 - fVar19;
        auVar46._4_4_ = fStack_2d4 - fVar19;
        auVar46._8_4_ = fStack_2d0 - fVar19;
        auVar46._12_4_ = fStack_2cc - fVar19;
        auVar36 = minps(_DAT_00963870,auVar46);
        local_310.m_data[0] = (float)(-(uint)(0.0 <= auVar46._0_4_) & auVar36._0_4_);
        local_310.m_data[1] = (float)(-(uint)(0.0 <= auVar46._4_4_) & auVar36._4_4_);
        iVar3 = pCVar1[iVar15].m_size.m_data[0];
        dim = pCVar1[iVar15].m_size.m_data[1];
        dim_00 = pCVar1[iVar16].m_size.m_data[0];
        dim_01 = pCVar1[iVar16].m_size.m_data[1];
        dim_02 = pCVar1[iVar15].m_size.m_data[2];
        dim_03 = pCVar1[iVar16].m_size.m_data[2];
        iVar15 = iVar16;
        if ((0x32U >> ((byte)sampler->minFilter & 0x1f) & sampler->minFilter < FILTERMODE_LAST) == 1
           ) break;
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&quad10,sampler->normalizedCoords,iVar3,coord->m_data[0],
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&uBounds1_1,sampler->normalizedCoords,dim_00,coord->m_data[0],
                   (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&minVal,sampler->normalizedCoords,dim,coord->m_data[1],
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&maxVal,sampler->normalizedCoords,dim_01,coord->m_data[1],
                   (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&cz0,sampler->normalizedCoords,dim_02,coord->m_data[2],
                   (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
        TexVerifierUtil::computeNonNormalizedCoordBounds
                  ((TexVerifierUtil *)&c10,sampler->normalizedCoords,dim_03,coord->m_data[2],
                   (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
        fVar19 = quad10.p00.m_data[1];
        fVar20 = floorf(quad10.p00.m_data[0]);
        fVar21 = floorf(fVar19);
        fVar19 = uBounds1_1.m_data[1];
        fVar22 = floorf(uBounds1_1.m_data[0]);
        fVar23 = floorf(fVar19);
        fVar19 = minVal.m_data[1];
        fVar24 = floorf(minVal.m_data[0]);
        fVar25 = floorf(fVar19);
        fVar19 = maxVal.m_data[1];
        fVar26 = floorf(maxVal.m_data[0]);
        fVar27 = floorf(fVar19);
        fVar19 = cz0.m_data[1];
        fVar28 = floorf(cz0.m_data[0]);
        fVar29 = floorf(fVar19);
        fVar19 = c10.m_data[1];
        fVar30 = floorf(c10.m_data[0]);
        fVar19 = floorf(fVar19);
        for (iVar16 = (int)fVar28; iVar5 = (int)fVar24, iVar16 <= (int)fVar29; iVar16 = iVar16 + 1)
        {
          for (; iVar18 = (int)fVar20, iVar5 <= (int)fVar25; iVar5 = iVar5 + 1) {
            for (; iVar6 = (int)fVar30, iVar18 <= (int)fVar21; iVar18 = iVar18 + 1) {
              for (; iVar7 = (int)fVar26, iVar6 <= (int)fVar19; iVar6 = iVar6 + 1) {
                for (; iVar8 = (int)fVar22, iVar7 <= (int)fVar27; iVar7 = iVar7 + 1) {
                  while (iVar8 <= (int)fVar23) {
                    iVar9 = TexVerifierUtil::wrap(sampler->wrapS,iVar18,iVar3);
                    iVar10 = TexVerifierUtil::wrap(sampler->wrapT,iVar5,dim);
                    iVar14 = TexVerifierUtil::wrap(sampler->wrapR,iVar16,dim_02);
                    lookup<float>((tcu *)&quad00,access,sampler,iVar9,iVar10,iVar14);
                    iVar9 = TexVerifierUtil::wrap(sampler->wrapS,iVar8,dim_00);
                    iVar10 = TexVerifierUtil::wrap(sampler->wrapT,iVar7,dim_01);
                    iVar14 = TexVerifierUtil::wrap(sampler->wrapR,iVar6,dim_03);
                    lookup<float>((tcu *)&quad01,access_00,sampler,iVar9,iVar10,iVar14);
                    bVar2 = isLinearRangeValid(prec,&quad00.p00,&quad01.p00,&local_310,result);
                    iVar8 = iVar8 + 1;
                    if (bVar2) {
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
      }
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,iVar3,coord->m_data[0],
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_00,coord->m_data[0],
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim,coord->m_data[1],
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_01,coord->m_data[1],
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&wBounds0,sampler->normalizedCoords,dim_02,coord->m_data[2],
                 (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&wBounds1,sampler->normalizedCoords,dim_03,coord->m_data[2],
                 (prec->coordBits).m_data[2],(prec->uvwBits).m_data[2]);
      fVar19 = floorf(uBounds0.m_data[0] + -0.5);
      fVar20 = floorf(uBounds0.m_data[1] + -0.5);
      fVar21 = floorf(uBounds1.m_data[0] + -0.5);
      fVar22 = floorf(uBounds1.m_data[1] + -0.5);
      fVar23 = floorf(vBounds0.m_data[0] + -0.5);
      fVar24 = floorf(vBounds0.m_data[1] + -0.5);
      fVar25 = floorf(vBounds1.m_data[0] + -0.5);
      fVar26 = floorf(vBounds1.m_data[1] + -0.5);
      fVar27 = floorf(wBounds0.m_data[0] + -0.5);
      fVar28 = floorf(wBounds0.m_data[1] + -0.5);
      fVar29 = floorf(wBounds1.m_data[0] + -0.5);
      fVar30 = floorf(wBounds1.m_data[1] + -0.5);
      TVar4 = getTextureChannelClass((access->m_format).type);
      if (TVar4 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        local_520 = computeBilinearSearchStepForSnorm(prec);
      }
      else {
        local_520 = 0.0;
        if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_520 = computeBilinearSearchStepForUnorm(prec);
        }
      }
      uVar11 = (int)fVar27;
      while (uVar12 = (ulong)uVar11, (int)uVar11 <= (int)fVar28) {
        c_02 = uVar11 + 1;
        fVar27 = (float)(int)uVar11;
        local_2c0 = uVar12;
        iVar16 = (int)fVar23;
        while (iVar5 = iVar16, uVar11 = c_02, iVar5 <= (int)fVar24) {
          iVar18 = (int)fVar19;
          while (iVar16 = iVar5 + 1, iVar18 <= (int)fVar20) {
            ColorQuad::ColorQuad(&quad00);
            ColorQuad::ColorQuad(&quad01);
            iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar18,iVar3);
            iVar14 = iVar18 + 1;
            iVar7 = TexVerifierUtil::wrap(sampler->wrapS,iVar14,iVar3);
            iVar8 = TexVerifierUtil::wrap(sampler->wrapT,iVar5,dim);
            iVar16 = TexVerifierUtil::wrap(sampler->wrapT,iVar5 + 1,dim);
            iVar9 = TexVerifierUtil::wrap(sampler->wrapR,(int)uVar12,dim_02);
            iVar10 = TexVerifierUtil::wrap(sampler->wrapR,c_02,dim_02);
            lookupQuad(&quad00,access,sampler,iVar6,iVar7,iVar8,iVar16,iVar9);
            lookupQuad(&quad01,access,sampler,iVar6,iVar7,iVar8,iVar16,iVar10);
            local_278 = ZEXT416((uint)local_520);
            if (TVar4 == TEXTURECHANNELCLASS_FLOATING_POINT) {
              fVar31 = computeBilinearSearchStepFromFloatQuad(prec,&quad00);
              fVar32 = computeBilinearSearchStepFromFloatQuad(prec,&quad01);
              local_278._4_4_ = ~extraout_XMM0_Db & extraout_var._0_4_ | extraout_XMM0_Db;
              local_278._0_4_ =
                   ~-(uint)(fVar31 <= fVar32) & (uint)fVar32 |
                   (uint)fVar31 & -(uint)(fVar31 <= fVar32);
              local_278._8_4_ = ~extraout_XMM0_Dc & extraout_var._4_4_ | extraout_XMM0_Dc;
              local_278._12_4_ = ~extraout_XMM0_Dd & extraout_var._8_4_ | extraout_XMM0_Dd;
              iVar16 = extraout_EAX;
            }
            fVar33 = (float)iVar18;
            fVar45 = (uBounds0.m_data[0] + -0.5) - fVar33;
            auVar48._4_4_ = (uBounds0.m_data[1] + -0.5) - fVar33;
            iVar18 = -(uint)(1.0 < fVar45);
            iVar6 = -(uint)(1.0 < auVar48._4_4_);
            auVar37._4_4_ = iVar6;
            auVar37._0_4_ = iVar18;
            auVar37._8_4_ = iVar6;
            auVar37._12_4_ = iVar6;
            auVar36._8_8_ = auVar37._8_8_;
            auVar36._4_4_ = iVar18;
            auVar36._0_4_ = iVar18;
            uVar11 = movmskpd(iVar16,auVar36);
            fVar31 = 1.0;
            fVar32 = 0.0;
            fVar41 = 0.0;
            fVar43 = 0.0;
            if ((uVar11 & 1) == 0) {
              fVar31 = fVar45;
              fVar32 = auVar48._4_4_;
              fVar41 = 0.0 - fVar33;
              fVar43 = 0.0 - fVar33;
            }
            auVar47._0_12_ = ZEXT812(0x3f800000);
            auVar47._12_4_ = 0;
            if ((uVar11 & 2) == 0) {
              auVar48._0_4_ = auVar48._4_4_;
              auVar48._8_4_ = auVar48._4_4_;
              auVar48._12_4_ = auVar48._4_4_;
              auVar47 = auVar48;
            }
            fVar54 = (wBounds0.m_data[0] + -0.5) - fVar27;
            fVar59 = (wBounds0.m_data[1] + -0.5) - fVar27;
            fVar61 = (vBounds0.m_data[0] + -0.5) - (float)iVar5;
            fVar62 = (vBounds0.m_data[1] + -0.5) - (float)iVar5;
            auVar64._4_4_ = -(uint)(fVar59 < 0.0);
            auVar64._0_4_ = -(uint)(fVar54 < 0.0);
            auVar64._8_4_ = -(uint)(fVar61 < 0.0);
            auVar64._12_4_ = -(uint)(fVar62 < 0.0);
            uVar11 = movmskps(uVar11,auVar64);
            local_488 = 0.0;
            if (((uVar11 & 4) == 0) && (local_488 = 1.0, fVar61 <= 1.0)) {
              local_488 = fVar61;
            }
            local_2f8 = ZEXT816(0);
            if ((uVar11 & 8) == 0) {
              fVar61 = 1.0;
              if (fVar62 <= 1.0) {
                fVar61 = fVar62;
              }
              local_2f8 = ZEXT416((uint)fVar61);
            }
            local_484 = 0.0;
            if (((uVar11 & 1) == 0) && (local_484 = 1.0, fVar54 <= 1.0)) {
              local_484 = fVar54;
            }
            local_2e8 = 0.0;
            if (((uVar11 & 2) == 0) && (local_2e8 = 1.0, fVar59 <= 1.0)) {
              local_2e8 = fVar59;
            }
            uStack_2dc = 0;
            uStack_2e0 = 0;
            uStack_2e4 = 0;
            local_268 = (float)(~-(uint)(auVar48._4_4_ < 0.0) & auVar47._0_4_);
            uStack_264 = ~(uint)auVar48._4_4_ & auVar47._4_4_;
            uStack_260 = ~(uint)auVar48._4_4_ & auVar47._8_4_;
            uStack_25c = ~(uint)auVar48._4_4_ & auVar47._12_4_;
            uVar11 = (int)fVar29;
            while (uVar12 = local_2c0, iVar18 = iVar14, (int)uVar11 <= (int)fVar30) {
              c_00 = uVar11 + 1;
              fVar54 = (float)(int)uVar11;
              c = (int)fVar25;
              local_2b8 = (ulong)uVar11;
              while (uVar12 = (ulong)c, uVar11 = c_00, (int)c <= (int)fVar26) {
                fVar59 = (float)(int)c;
                c = c + 1;
                iVar16 = (int)fVar21;
                local_2b0 = uVar12;
                while (iVar16 <= (int)fVar22) {
                  ColorQuad::ColorQuad(&quad10);
                  ColorQuad::ColorQuad((ColorQuad *)&uBounds1_1);
                  iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar16,dim_00);
                  c_01 = iVar16 + 1;
                  iVar7 = TexVerifierUtil::wrap(sampler->wrapS,c_01,dim_00);
                  iVar8 = TexVerifierUtil::wrap(sampler->wrapT,(int)local_2b0,dim_01);
                  iVar18 = TexVerifierUtil::wrap(sampler->wrapT,c,dim_01);
                  iVar9 = TexVerifierUtil::wrap(sampler->wrapR,(int)local_2b8,dim_03);
                  iVar10 = TexVerifierUtil::wrap(sampler->wrapR,c_00,dim_03);
                  lookupQuad(&quad10,access_00,sampler,iVar6,iVar7,iVar8,iVar18,iVar9);
                  lookupQuad((ColorQuad *)&uBounds1_1,access_00,sampler,iVar6,iVar7,iVar8,iVar18,
                             iVar10);
                  fVar61 = local_520;
                  if (TVar4 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                    fVar61 = computeBilinearSearchStepFromFloatQuad(prec,&quad10);
                    fVar62 = computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&uBounds1_1);
                    fVar61 = (float)(~-(uint)(fVar61 <= fVar62) & (uint)fVar62 |
                                    (uint)fVar61 & -(uint)(fVar61 <= fVar62));
                    iVar18 = extraout_EAX_00;
                  }
                  fVar55 = (uBounds1.m_data[0] + -0.5) - (float)iVar16;
                  fVar60 = (uBounds1.m_data[1] + -0.5) - (float)iVar16;
                  iVar16 = -(uint)(1.0 < fVar55);
                  iVar6 = -(uint)(1.0 < fVar60);
                  auVar39._4_4_ = iVar6;
                  auVar39._0_4_ = iVar16;
                  auVar39._8_4_ = iVar6;
                  auVar39._12_4_ = iVar6;
                  auVar38._8_8_ = auVar39._8_8_;
                  auVar38._4_4_ = iVar16;
                  auVar38._0_4_ = iVar16;
                  uVar11 = movmskpd(iVar18,auVar38);
                  fVar62 = 1.0;
                  if ((uVar11 & 1) == 0) {
                    fVar62 = fVar55;
                  }
                  fVar50 = 1.0;
                  if ((uVar11 & 2) == 0) {
                    fVar50 = fVar60;
                  }
                  fVar34 = (wBounds1.m_data[0] + -0.5) - fVar54;
                  fVar40 = (wBounds1.m_data[1] + -0.5) - fVar54;
                  fVar42 = (vBounds1.m_data[0] + -0.5) - fVar59;
                  fVar44 = (vBounds1.m_data[1] + -0.5) - fVar59;
                  auVar49._4_4_ = -(uint)(fVar40 < 0.0);
                  auVar49._0_4_ = -(uint)(fVar34 < 0.0);
                  auVar49._8_4_ = -(uint)(fVar42 < 0.0);
                  auVar49._12_4_ = -(uint)(fVar44 < 0.0);
                  uVar11 = movmskps(uVar11,auVar49);
                  local_474 = 0.0;
                  if (((uVar11 & 4) == 0) && (local_474 = 1.0, fVar42 <= 1.0)) {
                    local_474 = fVar42;
                  }
                  fVar42 = 0.0;
                  if (((uVar11 & 8) == 0) && (fVar42 = 1.0, fVar44 <= 1.0)) {
                    fVar42 = fVar44;
                  }
                  local_4fc = 0.0;
                  if (((uVar11 & 1) == 0) && (local_4fc = 1.0, fVar34 <= 1.0)) {
                    local_4fc = fVar34;
                  }
                  fVar34 = 0.0;
                  if (((uVar11 & 2) == 0) && (fVar34 = 1.0, fVar40 <= 1.0)) {
                    fVar34 = fVar40;
                  }
                  min((tcu *)&cz0,&quad00);
                  min((tcu *)&c11,&quad01);
                  min(local_60,&quad10);
                  min(local_70,(ColorQuad *)&uBounds1_1);
                  min<float,4>((tcu *)&cz1,(Vector<float,_4> *)local_60,(Vector<float,_4> *)local_70
                              );
                  min<float,4>((tcu *)&c10,(Vector<float,_4> *)&c11,(Vector<float,_4> *)&cz1);
                  min<float,4>((tcu *)&maxVal,&cz0,(Vector<float,_4> *)&c10);
                  b = local_2a0;
                  operator-((tcu *)&minVal,(Vector<float,_4> *)&maxVal,local_2a0);
                  max((tcu *)&c10,&quad00);
                  max((tcu *)&cz1,&quad01);
                  max(local_70,&quad10);
                  max(local_308,(ColorQuad *)&uBounds1_1);
                  max<float,4>(local_60,(Vector<float,_4> *)local_70,(Vector<float,_4> *)local_308);
                  max<float,4>((tcu *)&c11,(Vector<float,_4> *)&cz1,(Vector<float,_4> *)local_60);
                  max<float,4>((tcu *)&cz0,&c10,&c11);
                  operator+((tcu *)&maxVal,(Vector<float,_4> *)&cz0,b);
                  greaterThanEqual<float,4>((tcu *)&c11,result,&minVal);
                  lessThanEqual<float,4>((tcu *)&cz1,result,(Vector<float,_4> *)&maxVal);
                  logicalAnd<bool,4>((tcu *)&c10,(Vector<bool,_4> *)&c11,(Vector<bool,_4> *)&cz1);
                  logicalNot<bool,4>(local_60,local_2a8);
                  logicalOr<bool,4>((tcu *)&cz0,(Vector<bool,_4> *)&c10,(Vector<bool,_4> *)local_60)
                  ;
                  bVar2 = boolAll<4>((Vector<bool,_4> *)&cz0);
                  iVar16 = c_01;
                  if (bVar2) {
                    fVar50 = (float)(~-(uint)(fVar60 < 0.0) & (uint)fVar50);
                    fVar56 = (float)(~-(uint)((float)local_278._0_4_ <= fVar61) & (uint)fVar61 |
                                    -(uint)((float)local_278._0_4_ <= fVar61) & local_278._0_4_);
                    fVar40 = local_268 + fVar56;
                    fVar44 = local_2f8._0_4_;
                    fVar63 = local_2e8 + fVar56;
                    fVar61 = local_268;
                    fVar60 = (float)(~-(uint)(fVar45 < 0.0) & (uint)fVar31);
                    uVar11 = ~(uint)auVar48._4_4_ & (uint)fVar32;
                    uVar52 = ~(uint)(0.0 - fVar33) & (uint)fVar41;
                    uVar53 = ~(uint)(0.0 - fVar33) & (uint)fVar43;
                    while (fVar60 < fVar40) {
                      s_01 = (float)(~-(uint)(fVar60 <= fVar61) & (uint)fVar61 |
                                    -(uint)(fVar60 <= fVar61) & (uint)fVar60);
                      s = 1.0 - s_01;
                      local_288 = fVar60;
                      uStack_284 = uVar11;
                      uStack_280 = uVar52;
                      uStack_27c = uVar53;
                      for (fVar58 = local_488; fVar58 < fVar44 + fVar56; fVar58 = fVar58 + fVar56) {
                        fVar60 = (float)(~-(uint)(fVar58 <= (float)local_2f8._0_4_) &
                                         local_2f8._0_4_ |
                                        -(uint)(fVar58 <= (float)local_2f8._0_4_) & (uint)fVar58);
                        operator*((tcu *)&c11,s,&quad00.p00);
                        fVar61 = 1.0 - fVar60;
                        operator*((tcu *)&c10,fVar61,(Vector<float,_4> *)&c11);
                        operator*(local_60,s_01,&quad00.p10);
                        operator*((tcu *)&cz1,fVar61,(Vector<float,_4> *)local_60);
                        operator+((tcu *)&cz0,(Vector<float,_4> *)&c10,(Vector<float,_4> *)&cz1);
                        operator*(local_308,s,&quad00.p01);
                        operator*(local_70,fVar60,(Vector<float,_4> *)local_308);
                        operator+((tcu *)&maxVal,(Vector<float,_4> *)&cz0,
                                  (Vector<float,_4> *)local_70);
                        operator*(local_298,s_01,&quad00.p11);
                        operator*(local_1f8,fVar60,(Vector<float,_4> *)local_298);
                        operator+((tcu *)&minVal,(Vector<float,_4> *)&maxVal,
                                  (Vector<float,_4> *)local_1f8);
                        operator*((tcu *)&cz1,s,&quad01.p00);
                        operator*((tcu *)&c11,fVar61,(Vector<float,_4> *)&cz1);
                        operator*(local_70,s_01,&quad01.p10);
                        operator*(local_60,fVar61,(Vector<float,_4> *)local_70);
                        operator+((tcu *)&c10,(Vector<float,_4> *)&c11,(Vector<float,_4> *)local_60)
                        ;
                        operator*(local_1f8,s,&quad01.p01);
                        operator*(local_308,fVar60,(Vector<float,_4> *)local_1f8);
                        operator+((tcu *)&cz0,(Vector<float,_4> *)&c10,(Vector<float,_4> *)local_308
                                 );
                        operator*(local_208,s_01,&quad01.p11);
                        operator*(local_298,fVar60,(Vector<float,_4> *)local_208);
                        operator+((tcu *)&maxVal,(Vector<float,_4> *)&cz0,
                                  (Vector<float,_4> *)local_298);
                        for (fVar61 = local_484; fVar61 < fVar63; fVar61 = fVar61 + fVar56) {
                          fVar60 = (float)(~-(uint)(fVar61 <= local_2e8) & (uint)local_2e8 |
                                          -(uint)(fVar61 <= local_2e8) & (uint)fVar61);
                          operator*((tcu *)&c10,1.0 - fVar60,&minVal);
                          operator*((tcu *)&c11,fVar60,&maxVal);
                          operator+((tcu *)&cz0,(Vector<float,_4> *)&c10,(Vector<float,_4> *)&c11);
                          for (fVar60 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar62);
                              fVar60 < fVar56 + fVar50; fVar60 = fVar60 + fVar56) {
                            s_02 = (float)(~-(uint)(fVar60 <= fVar50) & (uint)fVar50 |
                                          -(uint)(fVar60 <= fVar50) & (uint)fVar60);
                            s_00 = 1.0 - s_02;
                            for (fVar51 = local_474; fVar51 < fVar56 + fVar42;
                                fVar51 = fVar51 + fVar56) {
                              fVar57 = (float)(~-(uint)(fVar51 <= fVar42) & (uint)fVar42 |
                                              -(uint)(fVar51 <= fVar42) & (uint)fVar51);
                              operator*(local_70,s_00,&quad10.p00);
                              fVar35 = 1.0 - fVar57;
                              operator*(local_60,fVar35,(Vector<float,_4> *)local_70);
                              operator*(local_1f8,s_02,&quad10.p10);
                              operator*(local_308,fVar35,(Vector<float,_4> *)local_1f8);
                              operator+((tcu *)&cz1,(Vector<float,_4> *)local_60,
                                        (Vector<float,_4> *)local_308);
                              operator*(local_208,s_00,&quad10.p01);
                              operator*(local_298,fVar57,(Vector<float,_4> *)local_208);
                              operator+((tcu *)&c11,(Vector<float,_4> *)&cz1,
                                        (Vector<float,_4> *)local_298);
                              operator*((tcu *)&local_218,s_02,&quad10.p11);
                              operator*(local_40,fVar57,&local_218);
                              operator+((tcu *)&c10,(Vector<float,_4> *)&c11,
                                        (Vector<float,_4> *)local_40);
                              operator*(local_308,s_00,(Vector<float,_4> *)&uBounds1_1);
                              operator*(local_70,fVar35,(Vector<float,_4> *)local_308);
                              operator*(local_298,s_02,&local_238);
                              operator*(local_1f8,fVar35,(Vector<float,_4> *)local_298);
                              operator+(local_60,(Vector<float,_4> *)local_70,
                                        (Vector<float,_4> *)local_1f8);
                              operator*(local_40,s_00,&local_248);
                              operator*(local_208,fVar57,(Vector<float,_4> *)local_40);
                              operator+((tcu *)&cz1,(Vector<float,_4> *)local_60,
                                        (Vector<float,_4> *)local_208);
                              operator*(local_50,s_02,&local_228);
                              operator*((tcu *)&local_218,fVar57,(Vector<float,_4> *)local_50);
                              operator+((tcu *)&c11,&cz1,&local_218);
                              for (fVar35 = local_4fc; fVar35 < fVar56 + fVar34;
                                  fVar35 = fVar35 + fVar56) {
                                fVar57 = (float)(~-(uint)(fVar35 <= fVar34) & (uint)fVar34 |
                                                -(uint)(fVar35 <= fVar34) & (uint)fVar35);
                                operator*(local_60,1.0 - fVar57,&c10);
                                operator*(local_70,fVar57,&c11);
                                operator+((tcu *)&cz1,(Vector<float,_4> *)local_60,
                                          (Vector<float,_4> *)local_70);
                                bVar2 = isLinearRangeValid(prec,&cz0,&cz1,&local_310,result);
                                if (bVar2) {
                                  return true;
                                }
                              }
                            }
                          }
                        }
                        fVar61 = local_268;
                      }
                      uVar11 = uStack_284;
                      uVar52 = uStack_280;
                      uVar53 = uStack_27c;
                      fVar60 = local_288 + fVar56;
                    }
                  }
                }
              }
            }
          }
        }
      }
    } while( true );
  }
  if ((FVar13 == LINEAR_MIPMAP_NEAREST) || (FVar13 == NEAREST_MIPMAP_NEAREST)) {
    fVar19 = ceilf(fVar20 + 0.5);
    iVar3 = (int)fVar19 + -1;
    iVar17 = iVar15;
    if (iVar3 < iVar15) {
      iVar17 = iVar3;
    }
    if (iVar3 < 0) {
      iVar17 = 0;
    }
    fVar19 = floorf(fVar21 + 0.5);
    iVar3 = (int)fVar19;
    if (iVar3 < iVar15) {
      iVar15 = iVar3;
    }
    if (iVar3 < 0) {
      iVar15 = 0;
    }
    do {
      FVar13 = NEAREST;
      if (iVar15 < iVar17) {
        return false;
      }
      uVar11 = sampler->minFilter - LINEAR;
      if (uVar11 < 5) {
        FVar13 = *(FilterMode *)(&DAT_00a2f990 + (ulong)uVar11 * 4);
      }
      bVar2 = isLevelSampleResultValid(texture->m_levels + iVar17,sampler,FVar13,prec,coord,result);
      iVar17 = iVar17 + 1;
    } while (!bVar2);
  }
  else {
    bVar2 = isLevelSampleResultValid(texture->m_levels,sampler,FVar13,prec,coord,result);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool isLookupResultValid (const Texture3DView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, result))
				return true;
		}
	}

	return false;
}